

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateMemberConstexprConstructor
          (SingularString *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar2 = "$name$_(nullptr, false)";
    uVar1 = 0x17;
  }
  else {
    pcVar2 = "$name$_(\n    &$pbi$::fixed_address_empty_string,\n    ::_pbi::ConstantInitialized())"
    ;
    uVar1 = 0x53;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_(nullptr, false)");
    } else {
      p->Emit(
          "$name$_(\n"
          "    &$pbi$::fixed_address_empty_string,\n"
          "    ::_pbi::ConstantInitialized())");
    }
  }